

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  undefined8 uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  undefined1 auVar5 [64];
  undefined4 unaff_retaddr;
  ImGuiCond unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImVec2 pos;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  float local_18;
  float fStack_14;
  ImGuiWindow *window;
  undefined1 extraout_var [56];
  
  pIVar3 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    if (GImGui->ActiveIdWindow->MoveId != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(GImGui->ActiveId);
    if (((pIVar3->IO).MouseDown[0] & 1U) != 0) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  bVar4 = false;
  if (pIVar3->MovingWindow != (ImGuiWindow *)0x0) {
    bVar4 = pIVar3->MovingWindow->RootWindow != (ImGuiWindow *)0x0;
  }
  if (!bVar4) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xda7,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  window = pIVar3->MovingWindow->RootWindow;
  if ((((pIVar3->IO).MouseDown[0] & 1U) == 0) || (bVar4 = IsMousePosValid((ImVec2 *)window), !bVar4)
     ) {
    ClearActiveID();
    pIVar3->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  auVar5._0_8_ = ::operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x1b5cd1);
  auVar5._8_56_ = extraout_var;
  uVar2 = vmovlpd_avx(auVar5._0_16_);
  fVar1 = (window->Pos).x;
  local_18 = (float)uVar2;
  if ((fVar1 == local_18) && (!NAN(fVar1) && !NAN(local_18))) {
    fVar1 = (window->Pos).y;
    fStack_14 = (float)((ulong)uVar2 >> 0x20);
    if ((fVar1 == fStack_14) && (!NAN(fVar1) && !NAN(fStack_14))) goto LAB_001b5d1f;
  }
  MarkIniSettingsDirty(window);
  SetWindowPos((ImGuiWindow *)pos,in_stack_00000008,unaff_retaddr_00);
LAB_001b5d1f:
  FocusWindow((ImGuiWindow *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}